

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * cs_impl::file_system::get_current_dir_abi_cxx11_(void)

{
  char *pcVar1;
  int *piVar2;
  undefined8 uVar3;
  ostream *this;
  runtime_error *this_00;
  string *in_RDI;
  stringstream str;
  int error;
  char temp [4096];
  string *in_stack_ffffffffffffed88;
  runtime_error *in_stack_ffffffffffffed90;
  stringstream local_11f8 [16];
  ostream local_11e8 [382];
  undefined1 local_106a;
  allocator local_1069;
  string local_1068 [38];
  undefined1 local_1042;
  allocator local_1041;
  string local_1040 [32];
  int local_1020;
  allocator local_1009;
  char local_1008 [4104];
  
  memset(local_1008,0,0x1000);
  pcVar1 = getcwd(local_1008,0x1000);
  if (pcVar1 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,local_1008,&local_1009);
    std::allocator<char>::~allocator((allocator<char> *)&local_1009);
    return in_RDI;
  }
  piVar2 = __errno_location();
  local_1020 = *piVar2;
  if (local_1020 != 0xc) {
    if (local_1020 == 0xd) {
      local_1042 = 1;
      uVar3 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1040,"Permission denied",&local_1041);
      cs::runtime_error::runtime_error(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
      local_1042 = 0;
      __cxa_throw(uVar3,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream(local_11f8);
    this = std::operator<<(local_11e8,"Unrecognised errno: ");
    std::ostream::operator<<(this,local_1020);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    cs::runtime_error::runtime_error(this_00,in_stack_ffffffffffffed88);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  local_106a = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1068,"Out of memory",&local_1069);
  cs::runtime_error::runtime_error(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
  local_106a = 0;
  __cxa_throw(uVar3,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

std::string get_current_dir()
		{
			char temp[PATH_MAX] = "";

			if (::getcwd(temp, PATH_MAX) != nullptr) {
				return std::string(temp);
			}

			int error = errno;
			switch (error) {
			case EACCES:
				throw cs::runtime_error("Permission denied");

			case ENOMEM:
				throw cs::runtime_error("Out of memory");

			default: {
				std::stringstream str;
				str << "Unrecognised errno: " << error;
				throw cs::runtime_error(str.str());
			}
			}
		}